

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O2

void __thiscall HDual::major_updateFtranFinal(HDual *this)

{
  int iVar1;
  HVector *this_00;
  HVector *this_01;
  HVector_ptr pHVar2;
  HVector_ptr pHVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  ulong uVar9;
  long lVar10;
  undefined4 uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int i;
  ulong uVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  
  uVar7 = rdtsc();
  uVar11 = (undefined4)((ulong)uVar7 >> 0x20);
  auVar8._4_4_ = uVar11;
  auVar8._0_4_ = uVar11;
  auVar8._8_4_ = 0;
  auVar18._0_12_ = auVar8 << 0x20;
  auVar18._12_4_ = 0x45300000;
  (this->model->timer).itemStart[0x14] =
       (auVar18._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
  if ((this->dualRHS).workCount < 0) {
    uVar9 = (ulong)(uint)this->multi_nFinish;
    if (this->multi_nFinish < 1) {
      uVar9 = 0;
    }
    for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      pHVar2 = this->multi_finish[uVar12].column;
      pHVar2->count = -1;
      pHVar3 = this->multi_finish[uVar12].row_ep;
      pHVar3->count = -1;
      pdVar4 = (pHVar2->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (pHVar3->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = (ulong)(uint)this->numRow;
      if (this->numRow < 1) {
        uVar13 = 0;
      }
      for (uVar14 = 0; uVar14 != uVar12; uVar14 = uVar14 + 1) {
        iVar1 = this->multi_finish[uVar14].rowOut;
        dVar19 = this->multi_finish[uVar14].alphaRow;
        pdVar6 = ((this->multi_finish[uVar14].column)->array).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar20 = pdVar5[iVar1];
        if (1e-14 < ABS(pdVar4[iVar1])) {
          dVar21 = pdVar4[iVar1] / dVar19;
          for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
            pdVar4[uVar17] = pdVar6[uVar17] * -dVar21 + pdVar4[uVar17];
          }
          pdVar4[iVar1] = dVar21;
        }
        if (1e-14 < ABS(dVar20)) {
          dVar20 = dVar20 / dVar19;
          for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
            pdVar5[uVar17] = pdVar6[uVar17] * -dVar20 + pdVar5[uVar17];
          }
          pdVar5[iVar1] = dVar20;
        }
      }
    }
  }
  else {
    lVar16 = 0;
    for (lVar10 = 0; lVar10 < this->multi_nFinish; lVar10 = lVar10 + 1) {
      this_00 = this->multi_finish[lVar10].row_ep;
      this_01 = this->multi_finish[lVar10].column;
      for (lVar15 = 0; lVar16 != lVar15; lVar15 = lVar15 + 0x78) {
        iVar1 = *(int *)((long)&this->multi_finish[0].rowOut + lVar15);
        dVar19 = (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1];
        if (1e-14 < ABS(dVar19)) {
          dVar19 = dVar19 / *(double *)((long)&this->multi_finish[0].alphaRow + lVar15);
          HVector::saxpy(this_01,-dVar19,*(HVector **)((long)&this->multi_finish[0].column + lVar15)
                        );
          (this_01->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = dVar19;
        }
        dVar19 = (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1];
        if (1e-14 < ABS(dVar19)) {
          dVar19 = dVar19 / *(double *)((long)&this->multi_finish[0].alphaRow + lVar15);
          HVector::saxpy(this_00,-dVar19,*(HVector **)((long)&this->multi_finish[0].column + lVar15)
                        );
          (this_00->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar1] = dVar19;
        }
      }
      lVar16 = lVar16 + 0x78;
    }
  }
  HTimer::recordFinish(&this->model->timer,0x14);
  return;
}

Assistant:

void HDual::major_updateFtranFinal() {
    model->timer.recordStart(HTICK_FTRAN_MIX);
    int updateFTRAN_inDense = dualRHS.workCount < 0;
    if (updateFTRAN_inDense) {
        for (int iFn = 0; iFn < multi_nFinish; iFn++) {
            multi_finish[iFn].column->count = -1;
            multi_finish[iFn].row_ep->count = -1;
            double *myCol = &multi_finish[iFn].column->array[0];
            double *myRow = &multi_finish[iFn].row_ep->array[0];
            for (int jFn = 0; jFn < iFn; jFn++) {
                int pivotRow = multi_finish[jFn].rowOut;
                const double pivotAlpha = multi_finish[jFn].alphaRow;
                const double *pivotArray = &multi_finish[jFn].column->array[0];
                double pivotX1 = myCol[pivotRow];
                double pivotX2 = myRow[pivotRow];

                // The FTRAN regular buffer
                if (fabs(pivotX1) > HSOL_CONST_TINY) {
                    const double pivot = pivotX1 / pivotAlpha;
#pragma omp parallel for
                    for (int i = 0; i < numRow; i++)
                        myCol[i] -= pivot * pivotArray[i];
                    myCol[pivotRow] = pivot;
                }
                // The FTRAN-DSE buffer
                if (fabs(pivotX2) > HSOL_CONST_TINY) {
                    const double pivot = pivotX2 / pivotAlpha;
#pragma omp parallel for
                    for (int i = 0; i < numRow; i++)
                        myRow[i] -= pivot * pivotArray[i];
                    myRow[pivotRow] = pivot;
                }
            }
        }
    } else {
        for (int iFn = 0; iFn < multi_nFinish; iFn++) {
            MFinish *Fin = &multi_finish[iFn];
            HVector *Col = Fin->column;
            HVector *Row = Fin->row_ep;
            for (int jFn = 0; jFn < iFn; jFn++) {
                MFinish *jFinish = &multi_finish[jFn];
                int pivotRow = jFinish->rowOut;
                double pivotX1 = Col->array[pivotRow];
                // The FTRAN regular buffer
                if (fabs(pivotX1) > HSOL_CONST_TINY) {
                    pivotX1 /= jFinish->alphaRow;
                    Col->saxpy(-pivotX1, jFinish->column);
                    Col->array[pivotRow] = pivotX1;
                }
                // The FTRAN-DSE buffer
                double pivotX2 = Row->array[pivotRow];
                if (fabs(pivotX2) > HSOL_CONST_TINY) {
                    pivotX2 /= jFinish->alphaRow;
                    Row->saxpy(-pivotX2, jFinish->column);
                    Row->array[pivotRow] = pivotX2;
                }
            }
        }
    }
    model->timer.recordFinish(HTICK_FTRAN_MIX);
}